

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_client_diagnostic.c
# Opt level: O3

int IoTHubClient_Diagnostic_AddIfNecessary
              (IOTHUB_DIAGNOSTIC_SETTING_DATA *diagSetting,IOTHUB_MESSAGE_HANDLE messageHandle)

{
  byte bVar1;
  int iVar2;
  IOTHUB_MESSAGE_RESULT IVar3;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *diagnosticData;
  char *__ptr;
  IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *__s;
  time_t tVar4;
  LOGGER_LOG p_Var5;
  uint uVar6;
  byte bVar7;
  byte bVar8;
  uint32_t uVar9;
  char *pcVar10;
  long lVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dStack_30;
  
  if (messageHandle == (IOTHUB_MESSAGE_HANDLE)0x0 ||
      diagSetting == (IOTHUB_DIAGNOSTIC_SETTING_DATA *)0x0) {
    return 0xa1;
  }
  uVar6 = diagSetting->diagSamplingPercentage;
  if (uVar6 == 0) {
    return 0;
  }
  uVar9 = diagSetting->currentMessageNumber;
  if (uVar9 == 0xffffffff) {
    uVar9 = (uint32_t)(0xffffffff % (ulong)(uVar6 * 100));
  }
  dVar14 = (double)(uVar9 + 1);
  diagSetting->currentMessageNumber = uVar9 + 1;
  auVar13._0_8_ = (double)uVar6 * (dVar14 + -2.0);
  auVar13._8_8_ = (double)uVar6 * (dVar14 + -1.0);
  auVar13 = divpd(auVar13,_DAT_001802e0);
  dVar14 = floor(auVar13._0_8_);
  dStack_30 = auVar13._8_8_;
  dVar12 = floor(dStack_30);
  if (dVar12 <= dVar14) {
    return 0;
  }
  diagnosticData = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)malloc(0x10);
  if (diagnosticData == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 == (LOGGER_LOG)0x0) {
      return 0xa9;
    }
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
              ,"prepare_message_diagnostic_data",0x71,1,"malloc for DiagnosticData failed");
    return 0xa9;
  }
  __ptr = (char *)malloc(9);
  if (__ptr == (char *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"prepare_message_diagnostic_data",0x78,1,"malloc for diagId failed");
    }
    goto LAB_00123b5d;
  }
  lVar11 = 0;
  do {
    iVar2 = rand();
    uVar6 = (iVar2 / 0x24) % 0x24;
    bVar7 = (byte)(iVar2 % 0x24);
    bVar8 = bVar7 + 0x57;
    if ((uint)(iVar2 % 0x24) < 10) {
      bVar8 = bVar7 | 0x30;
    }
    bVar1 = (byte)uVar6;
    bVar7 = bVar1 + 0x57;
    if (uVar6 < 10) {
      bVar7 = bVar1 | 0x30;
    }
    __ptr[lVar11 * 2] = bVar8;
    __ptr[lVar11 * 2 + 1] = bVar7;
    lVar11 = lVar11 + 1;
  } while ((int)lVar11 != 4);
  __ptr[lVar11 * 2] = '\0';
  diagnosticData->diagnosticId = __ptr;
  __s = (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)malloc(0x1e);
  if (__s == (IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA *)0x0) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"prepare_message_diagnostic_data",0x86,1,"malloc for timeBuffer failed");
    }
    free(__ptr);
    goto LAB_00123b5d;
  }
  tVar4 = get_time((time_t *)0x0);
  if (tVar4 == -1) {
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar10 = "Failed getting current time";
      iVar2 = 0x1d;
      goto LAB_00123b0b;
    }
  }
  else {
    iVar2 = sprintf((char *)__s,"%lu",tVar4);
    if (-1 < iVar2) {
      diagnosticData->diagnosticCreationTimeUtc = (char *)__s;
      IVar3 = IoTHubMessage_SetDiagnosticPropertyData(messageHandle,diagnosticData);
      iVar2 = 0xaf;
      if (IVar3 == IOTHUB_MESSAGE_OK) {
        iVar2 = 0;
      }
      free(diagnosticData->diagnosticCreationTimeUtc);
      free(diagnosticData->diagnosticId);
      free(diagnosticData);
      return iVar2;
    }
    p_Var5 = xlogging_get_log_function();
    if (p_Var5 != (LOGGER_LOG)0x0) {
      pcVar10 = "Failed sprintf to timeBuffer with 8 bytes of time_t";
      iVar2 = 0x24;
LAB_00123b0b:
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
                ,"get_epoch_time",iVar2,1,pcVar10);
    }
  }
  p_Var5 = xlogging_get_log_function();
  if (p_Var5 != (LOGGER_LOG)0x0) {
    (*p_Var5)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothub_client_diagnostic.c"
              ,"prepare_message_diagnostic_data",0x8d,1,"Failed getting current time");
  }
  free(__ptr);
  free(diagnosticData);
  diagnosticData = __s;
LAB_00123b5d:
  free(diagnosticData);
  return 0xa9;
}

Assistant:

int IoTHubClient_Diagnostic_AddIfNecessary(IOTHUB_DIAGNOSTIC_SETTING_DATA* diagSetting, IOTHUB_MESSAGE_HANDLE messageHandle)
{
    int result;
    if (diagSetting == NULL || messageHandle == NULL)
    {
        result = MU_FAILURE;
    }
    else if (should_add_diagnostic_info(diagSetting))
    {

        IOTHUB_MESSAGE_DIAGNOSTIC_PROPERTY_DATA* diagnosticData;
        if ((diagnosticData = prepare_message_diagnostic_data()) == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (IoTHubMessage_SetDiagnosticPropertyData(messageHandle, diagnosticData) != IOTHUB_MESSAGE_OK)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            free(diagnosticData->diagnosticCreationTimeUtc);
            free(diagnosticData->diagnosticId);
            free(diagnosticData);
            diagnosticData = NULL;
        }
    }
    else
    {
        result = 0;
    }

    return result;
}